

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O2

uint16_t __thiscall
xray_re::xr_ogf_v4::motion_io::import_params(motion_io *this,xr_reader *r,uint version)

{
  uint16_t uVar1;
  uint32_t *puVar2;
  uint16_t *puVar3;
  float *pfVar4;
  uint *puVar5;
  pointer ppxVar6;
  xr_motion_marks *this_00;
  pointer ppxVar7;
  
  xr_reader::r_sz(r,&(this->super_xr_skl_motion).super_xr_motion.m_name);
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  (this->super_xr_skl_motion).m_flags = *puVar2;
  puVar3 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  (this->super_xr_skl_motion).m_bone_or_part = *puVar3;
  puVar3 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  uVar1 = *puVar3;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 3);
  (this->super_xr_skl_motion).m_speed = *(float *)(puVar3 + 1);
  pfVar4 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
  (this->super_xr_skl_motion).m_power = *pfVar4;
  pfVar4 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
  (this->super_xr_skl_motion).m_accrue = *pfVar4;
  pfVar4 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
  (this->super_xr_skl_motion).m_falloff = *pfVar4;
  if (version == 4) {
    puVar5 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar5 + 1);
    std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>::resize
              (&(this->super_xr_skl_motion).m_marks,(ulong)*puVar5);
    ppxVar6 = (this->super_xr_skl_motion).m_marks.
              super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppxVar7 = (this->super_xr_skl_motion).m_marks.
                   super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppxVar7 != ppxVar6;
        ppxVar7 = ppxVar7 + 1) {
      this_00 = (xr_motion_marks *)operator_new(0x38);
      (this_00->super_vector<xray_re::motion_mark,_std::allocator<xray_re::motion_mark>_>).
      super__Vector_base<xray_re::motion_mark,_std::allocator<xray_re::motion_mark>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->super_vector<xray_re::motion_mark,_std::allocator<xray_re::motion_mark>_>).
      super__Vector_base<xray_re::motion_mark,_std::allocator<xray_re::motion_mark>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->super_vector<xray_re::motion_mark,_std::allocator<xray_re::motion_mark>_>).
      super__Vector_base<xray_re::motion_mark,_std::allocator<xray_re::motion_mark>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->m_name)._M_dataplus._M_p = (pointer)&(this_00->m_name).field_2;
      (this_00->m_name)._M_string_length = 0;
      (this_00->m_name).field_2._M_local_buf[0] = '\0';
      xr_motion_marks::load(this_00,r);
      *ppxVar7 = this_00;
    }
  }
  return uVar1;
}

Assistant:

inline uint16_t xr_ogf_v4::motion_io::import_params(xr_reader& r, unsigned version)
{
	r.r_sz(m_name);
	m_flags = r.r_u32();
	m_bone_or_part = r.r_u16();
	uint16_t motion_id = r.r_u16();
	m_speed = r.r_float();
	m_power = r.r_float();
	m_accrue = r.r_float();
	m_falloff = r.r_float();
	if (version == OGF4_S_SMPARAMS_VERSION_4) {
		m_marks.resize(r.r_u32());
		for (xr_motion_marks_vec_it it = m_marks.begin(), end = m_marks.end(); it != end; ++it) {
			xr_motion_marks* mm = new xr_motion_marks;
			mm->load(r);
			*it = mm;
		}
	}
	return motion_id;
}